

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall
Centaurus::DFA<wchar_t>::DFA(DFA<wchar_t> *this,NFA<wchar_t> *nfa,bool optimize_flag)

{
  bool bVar1;
  int iVar2;
  iterator a;
  iterator b;
  vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> *this_00;
  reference this_01;
  IndexVector *this_02;
  DFAState<wchar_t> *state;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> *__range2;
  int accept_state_index;
  IndexVector local_80;
  undefined1 local_50 [8];
  set<int,_std::less<int>,_std::allocator<int>_> ec0;
  bool long_flag;
  bool optimize_flag_local;
  NFA<wchar_t> *nfa_local;
  DFA<wchar_t> *this_local;
  
  ec0._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = optimize_flag;
  NFABase<Centaurus::DFAState<wchar_t>_>::NFABase
            (&this->super_NFABase<Centaurus::DFAState<wchar_t>_>);
  (this->super_NFABase<Centaurus::DFAState<wchar_t>_>)._vptr_NFABase =
       (_func_int **)&PTR__DFA_00290138;
  ec0._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  NFA<wchar_t>::epsilon_closure
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50,nfa,0,
             (bool *)((long)&ec0._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  a = std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  b = std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  IndexVector::IndexVector<std::_Rb_tree_const_iterator<int>>
            (&local_80,(_Rb_tree_const_iterator<int>)a._M_node,
             (_Rb_tree_const_iterator<int>)b._M_node);
  std::vector<Centaurus::DFAState<wchar_t>,std::allocator<Centaurus::DFAState<wchar_t>>>::
  emplace_back<Centaurus::IndexVector,bool&>
            ((vector<Centaurus::DFAState<wchar_t>,std::allocator<Centaurus::DFAState<wchar_t>>> *)
             &(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states,&local_80,
             (bool *)((long)&ec0._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  IndexVector::~IndexVector(&local_80);
  fork_states(this,0,nfa);
  iVar2 = NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::get_state_num
                    (&nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>);
  this_00 = &(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states;
  __end0 = std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ::begin(this_00);
  state = (DFAState<wchar_t> *)
          std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
          ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Centaurus::DFAState<wchar_t>_*,_std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>_>
                                     *)&state), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<Centaurus::DFAState<wchar_t>_*,_std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>_>
              ::operator*(&__end0);
    this_02 = NFABaseState<wchar_t,_Centaurus::IndexVector>::label
                        (&this_01->super_NFABaseState<wchar_t,_Centaurus::IndexVector>);
    bVar1 = IndexVector::includes(this_02,iVar2 + -1);
    if (bVar1) {
      DFAState<wchar_t>::set_accept(this_01,true);
    }
    NFABaseState<wchar_t,_Centaurus::IndexVector>::sort
              (&this_01->super_NFABaseState<wchar_t,_Centaurus::IndexVector>);
    __gnu_cxx::
    __normal_iterator<Centaurus::DFAState<wchar_t>_*,_std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  if ((ec0._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    minimize(this);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

DFA(const NFA<TCHAR>& nfa, bool optimize_flag = true)
	{
		//Start by collecting the epsilon closure of start state
        bool long_flag = false;
		std::set<int> ec0 = nfa.epsilon_closure(0, long_flag);

		//Create the start state
		m_states.emplace_back(IndexVector(ec0.cbegin(), ec0.cend()), long_flag);

		//Recursively construct the DFA
		fork_states(0, nfa);

		int accept_state_index = nfa.get_state_num() - 1;

		for (auto& state : m_states)
		{
			if (state.label().includes(accept_state_index))
			{
				//state.add_transition(CharClass<TCHAR>(), -1);
				state.set_accept();
			}

            state.sort();
		}

        if (optimize_flag)
            minimize();
	}